

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGB1555ToUVRow_C(uint8_t *src_argb1555,int src_stride_argb1555,uint8_t *dst_u,uint8_t *dst_v,
                      int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  ushort uVar4;
  ushort uVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [13];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [13];
  undefined3 uVar26;
  undefined5 uVar27;
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [14];
  undefined1 auVar31 [14];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  long lVar36;
  byte *pbVar37;
  byte bVar38;
  uint uVar39;
  uint uVar40;
  int iVar41;
  uint uVar42;
  byte bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  byte bVar46;
  undefined1 uVar49;
  undefined1 uVar50;
  undefined1 uVar51;
  undefined1 uVar52;
  undefined1 uVar53;
  undefined1 uVar54;
  undefined1 uVar55;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  auVar35 = _DAT_004d2930;
  auVar34 = _DAT_004d2920;
  auVar33 = _DAT_004d2900;
  auVar32 = _DAT_004d28d0;
  lVar36 = (long)src_stride_argb1555;
  if (width < 2) {
    pbVar37 = src_argb1555 + lVar36;
  }
  else {
    iVar41 = 0;
    do {
      bVar46 = *src_argb1555;
      bVar1 = src_argb1555[2];
      bVar2 = src_argb1555[lVar36];
      bVar3 = src_argb1555[lVar36 + 2];
      uVar39 = ((uint)(byte)(bVar46 >> 2 & 7 | bVar46 * '\b') +
                (uint)(byte)(bVar2 >> 2 & 7 | bVar2 * '\b') + 1 >> 1 & 0xff) +
               ((uint)(byte)(bVar3 >> 2 & 7 | bVar3 * '\b') +
                (uint)(byte)(bVar1 >> 2 & 7 | bVar1 * '\b') + 1 >> 1 & 0xff) + 1 >> 1;
      uVar4 = CONCAT11(src_argb1555[3],src_argb1555[1]);
      auVar44 = psllw(ZEXT216(uVar4),3);
      auVar44 = auVar44 & ZEXT416(0x1818) | ZEXT216((ushort)(CONCAT11(bVar1,bVar46) >> 5)) & auVar33
      ;
      uVar5 = CONCAT11(src_argb1555[lVar36 + 3],src_argb1555[lVar36 + 1]);
      auVar47 = psllw(ZEXT216(uVar5),3);
      auVar48 = auVar47 & ZEXT416(0x1818) | ZEXT216((ushort)(CONCAT11(bVar3,bVar2) >> 5)) & auVar33;
      auVar45 = psllw(auVar44,3);
      auVar47._0_2_ = auVar44._0_2_ >> 2;
      auVar47._2_6_ = 0;
      auVar47._8_2_ = auVar44._8_2_ >> 2;
      auVar47._10_2_ = auVar44._10_2_ >> 2;
      auVar47._12_2_ = auVar44._12_2_ >> 2;
      auVar47._14_2_ = auVar44._14_2_ >> 2;
      auVar44 = auVar47 & auVar34 | auVar45 & auVar32;
      auVar47 = psllw(auVar48,3);
      auVar45._0_2_ = auVar48._0_2_ >> 2;
      auVar45._2_6_ = 0;
      auVar45._8_2_ = auVar48._8_2_ >> 2;
      auVar45._10_2_ = auVar48._10_2_ >> 2;
      auVar45._12_2_ = auVar48._12_2_ >> 2;
      auVar45._14_2_ = auVar48._14_2_ >> 2;
      auVar47 = auVar45 & auVar34 | auVar47 & auVar32;
      bVar46 = pavgb(auVar47[0],auVar44[0]);
      uVar49 = pavgb(auVar47[1],auVar44[1]);
      pavgb(auVar47[2],auVar44[2]);
      pavgb(auVar47[3],auVar44[3]);
      uVar50 = pavgb(auVar47[4],auVar44[4]);
      uVar51 = pavgb(auVar47[5],auVar44[5]);
      uVar52 = pavgb(auVar47[6],auVar44[6]);
      uVar53 = pavgb(auVar47[7],auVar44[7]);
      uVar54 = pavgb(auVar47[8],auVar44[8]);
      uVar55 = pavgb(auVar47[9],auVar44[9]);
      uVar26 = CONCAT12(uVar55,CONCAT11(uVar54,uVar53));
      uVar55 = pavgb(auVar47[10],auVar44[10]);
      uVar40 = CONCAT13(uVar55,uVar26);
      uVar55 = pavgb(auVar47[0xb],auVar44[0xb]);
      uVar27 = CONCAT14(uVar55,uVar40);
      uVar55 = pavgb(auVar47[0xc],auVar44[0xc]);
      auVar30[5] = uVar55;
      auVar30._0_5_ = uVar27;
      pavgb(auVar47[0xd],auVar44[0xd]);
      pavgb(auVar47[0xe],auVar44[0xe]);
      pavgb(auVar47[0xf],auVar44[0xf]);
      auVar30._6_8_ = 0;
      auVar6[0xe] = uVar53;
      auVar6._0_14_ = auVar30 << 0x38;
      auVar28._4_8_ = 0;
      auVar28._0_4_ = uVar40;
      auVar8._12_3_ = (int3)(CONCAT26(auVar6._13_2_,CONCAT15(uVar52,uVar27)) >> 0x28);
      auVar8._0_12_ = auVar28 << 0x38;
      auVar10._10_5_ = (int5)(CONCAT44(auVar8._11_4_,CONCAT13(uVar51,uVar26)) >> 0x18);
      auVar10._0_10_ = (unkuint10)CONCAT11(uVar54,uVar53) << 0x38;
      auVar14._7_8_ = 0;
      auVar14._0_7_ = (uint7)(CONCAT62(auVar10._9_6_,CONCAT11(uVar50,uVar53)) >> 8);
      auVar15._8_7_ = 0;
      auVar15._0_8_ = SUB158(auVar14 << 0x40,7);
      auVar16._9_6_ = 0;
      auVar16._0_9_ = SUB159(auVar15 << 0x38,6);
      auVar17._10_5_ = 0;
      auVar17._0_10_ = SUB1510(auVar16 << 0x30,5);
      auVar18._11_4_ = 0;
      auVar18._0_11_ = SUB1511(auVar17 << 0x28,4);
      auVar19._1_12_ = SUB1512(auVar18 << 0x20,3);
      auVar19[0] = uVar49;
      auVar12[1] = 0;
      auVar12[0] = bVar46;
      auVar12._2_13_ = auVar19;
      uVar42 = ((uint)auVar19._0_2_ + auVar12._0_4_ + 1 & 0xffff) >> 1;
      auVar44 = ZEXT216(uVar4 >> 4) & ZEXT416(0x707) |
                ZEXT216(CONCAT11(src_argb1555[3] * '\x02',src_argb1555[1] * '\x02')) & auVar35;
      auVar47 = ZEXT216(uVar5 >> 4) & ZEXT416(0x707) |
                ZEXT216(CONCAT11(src_argb1555[lVar36 + 3] * '\x02',src_argb1555[lVar36 + 1] * '\x02'
                                )) & auVar35;
      bVar46 = pavgb(auVar47[0],auVar44[0]);
      uVar49 = pavgb(auVar47[1],auVar44[1]);
      pavgb(0,0);
      pavgb(0,0);
      uVar50 = pavgb(0,0);
      uVar51 = pavgb(0,0);
      uVar52 = pavgb(0,0);
      uVar53 = pavgb(0,0);
      uVar54 = pavgb(auVar47[8],auVar44[8]);
      uVar55 = pavgb(auVar47[9],auVar44[9]);
      uVar26 = CONCAT12(uVar55,CONCAT11(uVar54,uVar53));
      uVar55 = pavgb(auVar47[10],auVar44[10]);
      uVar40 = CONCAT13(uVar55,uVar26);
      uVar55 = pavgb(auVar47[0xb],auVar44[0xb]);
      uVar27 = CONCAT14(uVar55,uVar40);
      uVar55 = pavgb(auVar47[0xc],auVar44[0xc]);
      auVar31[5] = uVar55;
      auVar31._0_5_ = uVar27;
      pavgb(auVar47[0xd],auVar44[0xd]);
      pavgb(auVar47[0xe],auVar44[0xe]);
      pavgb(auVar47[0xf],auVar44[0xf]);
      auVar31._6_8_ = 0;
      auVar7[0xe] = uVar53;
      auVar7._0_14_ = auVar31 << 0x38;
      auVar29._4_8_ = 0;
      auVar29._0_4_ = uVar40;
      auVar9._12_3_ = (int3)(CONCAT26(auVar7._13_2_,CONCAT15(uVar52,uVar27)) >> 0x28);
      auVar9._0_12_ = auVar29 << 0x38;
      auVar11._10_5_ = (int5)(CONCAT44(auVar9._11_4_,CONCAT13(uVar51,uVar26)) >> 0x18);
      auVar11._0_10_ = (unkuint10)CONCAT11(uVar54,uVar53) << 0x38;
      auVar20._7_8_ = 0;
      auVar20._0_7_ = (uint7)(CONCAT62(auVar11._9_6_,CONCAT11(uVar50,uVar53)) >> 8);
      auVar21._8_7_ = 0;
      auVar21._0_8_ = SUB158(auVar20 << 0x40,7);
      auVar22._9_6_ = 0;
      auVar22._0_9_ = SUB159(auVar21 << 0x38,6);
      auVar23._10_5_ = 0;
      auVar23._0_10_ = SUB1510(auVar22 << 0x30,5);
      auVar24._11_4_ = 0;
      auVar24._0_11_ = SUB1511(auVar23 << 0x28,4);
      auVar25._1_12_ = SUB1512(auVar24 << 0x20,3);
      auVar25[0] = uVar49;
      auVar13[1] = 0;
      auVar13[0] = bVar46;
      auVar13._2_13_ = auVar25;
      uVar40 = (auVar13._0_4_ + (uint)auVar25._0_2_ + 1 & 0xffff) >> 1;
      *dst_u = (uint8_t)((uVar40 * 0xffda ^ 0x8000) + uVar39 * 0x70 + uVar42 * 0xffb6 >> 8);
      *dst_v = (uint8_t)((uVar39 * 0xffee ^ 0x8000) + uVar40 * 0x70 + uVar42 * 0xffa2 >> 8);
      src_argb1555 = src_argb1555 + 4;
      dst_u = dst_u + 1;
      dst_v = dst_v + 1;
      iVar41 = iVar41 + 2;
    } while (iVar41 < width + -1);
    pbVar37 = src_argb1555 + lVar36;
  }
  if ((width & 1U) != 0) {
    bVar46 = *src_argb1555;
    bVar1 = src_argb1555[1];
    bVar38 = bVar1 * '\b' | bVar46 >> 5;
    bVar2 = *pbVar37;
    bVar3 = pbVar37[1];
    bVar43 = bVar3 * '\b' | bVar2 >> 5;
    uVar42 = (uint)(byte)(bVar46 >> 2 & 7 | bVar46 * '\b') +
             (uint)(byte)(bVar2 >> 2 & 7 | bVar2 * '\b') + 1 >> 1 & 0xff;
    uVar39 = (uint)(byte)((bVar38 & 0x1c) >> 2 | bVar38 << 3) +
             (uint)(byte)((bVar43 & 0x1c) >> 2 | bVar43 << 3) + 1 >> 1 & 0xff;
    uVar40 = (uint)(bVar1 >> 4 & 7 | bVar1 * '\x02' & 0xf8) +
             (uint)(byte)(bVar3 & 0xf8 | bVar3 >> 5) + 1 >> 1 & 0xff;
    *dst_u = (uint8_t)((uVar40 * 0xffda ^ 0x8000) + uVar42 * 0x70 + uVar39 * 0xffb6 >> 8);
    *dst_v = (uint8_t)(uVar42 * 0xffee + uVar40 * 0x70 + 0x8000 + uVar39 * 0xffa2 >> 8);
  }
  return;
}

Assistant:

void ARGB1555ToUVRow_C(const uint8_t* src_argb1555,
                       int src_stride_argb1555,
                       uint8_t* dst_u,
                       uint8_t* dst_v,
                       int width) {
  const uint8_t* next_argb1555 = src_argb1555 + src_stride_argb1555;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    uint8_t b0 = src_argb1555[0] & 0x1f;
    uint8_t g0 = (src_argb1555[0] >> 5) | ((src_argb1555[1] & 0x03) << 3);
    uint8_t r0 = (src_argb1555[1] & 0x7c) >> 2;
    uint8_t b1 = src_argb1555[2] & 0x1f;
    uint8_t g1 = (src_argb1555[2] >> 5) | ((src_argb1555[3] & 0x03) << 3);
    uint8_t r1 = (src_argb1555[3] & 0x7c) >> 2;
    uint8_t b2 = next_argb1555[0] & 0x1f;
    uint8_t g2 = (next_argb1555[0] >> 5) | ((next_argb1555[1] & 0x03) << 3);
    uint8_t r2 = (next_argb1555[1] & 0x7c) >> 2;
    uint8_t b3 = next_argb1555[2] & 0x1f;
    uint8_t g3 = (next_argb1555[2] >> 5) | ((next_argb1555[3] & 0x03) << 3);
    uint8_t r3 = (next_argb1555[3] & 0x7c) >> 2;

    b0 = (b0 << 3) | (b0 >> 2);
    g0 = (g0 << 3) | (g0 >> 2);
    r0 = (r0 << 3) | (r0 >> 2);
    b1 = (b1 << 3) | (b1 >> 2);
    g1 = (g1 << 3) | (g1 >> 2);
    r1 = (r1 << 3) | (r1 >> 2);
    b2 = (b2 << 3) | (b2 >> 2);
    g2 = (g2 << 3) | (g2 >> 2);
    r2 = (r2 << 3) | (r2 >> 2);
    b3 = (b3 << 3) | (b3 >> 2);
    g3 = (g3 << 3) | (g3 >> 2);
    r3 = (r3 << 3) | (r3 >> 2);

#if defined(LIBYUV_ARGBTOUV_PAVGB)
    uint8_t ab = AVGB(AVGB(b0, b2), AVGB(b1, b3));
    uint8_t ag = AVGB(AVGB(g0, g2), AVGB(g1, g3));
    uint8_t ar = AVGB(AVGB(r0, r2), AVGB(r1, r3));
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
#else
    uint16_t b = (b0 + b1 + b2 + b3 + 1) >> 1;
    uint16_t g = (g0 + g1 + g2 + g3 + 1) >> 1;
    uint16_t r = (r0 + r1 + r2 + r3 + 1) >> 1;
    dst_u[0] = RGB2xToU(r, g, b);
    dst_v[0] = RGB2xToV(r, g, b);
#endif

    src_argb1555 += 4;
    next_argb1555 += 4;
    dst_u += 1;
    dst_v += 1;
  }
  if (width & 1) {
    uint8_t b0 = src_argb1555[0] & 0x1f;
    uint8_t g0 = (src_argb1555[0] >> 5) | ((src_argb1555[1] & 0x03) << 3);
    uint8_t r0 = (src_argb1555[1] & 0x7c) >> 2;
    uint8_t b2 = next_argb1555[0] & 0x1f;
    uint8_t g2 = (next_argb1555[0] >> 5) | ((next_argb1555[1] & 0x03) << 3);
    uint8_t r2 = next_argb1555[1] >> 3;

    b0 = (b0 << 3) | (b0 >> 2);
    g0 = (g0 << 3) | (g0 >> 2);
    r0 = (r0 << 3) | (r0 >> 2);
    b2 = (b2 << 3) | (b2 >> 2);
    g2 = (g2 << 3) | (g2 >> 2);
    r2 = (r2 << 3) | (r2 >> 2);

#if defined(LIBYUV_ARGBTOUV_PAVGB)
    uint8_t ab = AVGB(b0, b2);
    uint8_t ag = AVGB(g0, g2);
    uint8_t ar = AVGB(r0, r2);
    dst_u[0] = RGBToU(ar, ag, ab);
    dst_v[0] = RGBToV(ar, ag, ab);
#else
    uint16_t b = b0 + b2;
    uint16_t g = g0 + g2;
    uint16_t r = r0 + r2;
    dst_u[0] = RGB2xToU(r, g, b);
    dst_v[0] = RGB2xToV(r, g, b);
#endif
  }
}